

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O1

int __thiscall HighsGFkSolve::link(HighsGFkSolve *this,char *__from,char *__to)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  pointer piVar11;
  int *piVar12;
  int *piVar13;
  char cVar14;
  HighsInt y;
  bool bVar15;
  int local_38;
  int local_34;
  HighsInt Nright;
  HighsInt Nleft;
  
  iVar10 = (int)__from;
  piVar4 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6[iVar10] = piVar5[piVar4[iVar10]];
  piVar11 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11[iVar10] = -1;
  piVar5[piVar4[iVar10]] = iVar10;
  lVar8 = (long)piVar6[iVar10];
  if (lVar8 != -1) {
    piVar11[lVar8] = iVar10;
  }
  piVar13 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar4[iVar10];
  *piVar13 = *piVar13 + 1;
  piVar5 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[iVar10];
  iVar9 = piVar6[iVar1];
  if (iVar9 == -1) {
    (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar10] = -1;
    piVar11 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + iVar10;
  }
  else {
    iVar2 = piVar4[iVar10];
    piVar12 = &local_34;
    local_34 = -1;
    piVar13 = &local_38;
    local_38 = -1;
    piVar11 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar7 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (iVar2 < piVar4[iVar9]) {
        iVar3 = piVar11[iVar9];
        lVar8 = (long)iVar3;
        if (lVar8 == -1) goto LAB_002a596a;
        if (iVar2 < piVar4[lVar8]) {
          piVar11[iVar9] = piVar7[lVar8];
          piVar7[lVar8] = iVar9;
          bVar15 = piVar11[lVar8] == -1;
          iVar9 = iVar3;
          if (bVar15) goto LAB_002a5972;
        }
        *piVar12 = iVar9;
        piVar12 = piVar11 + iVar9;
        iVar9 = *piVar12;
LAB_002a5929:
        cVar14 = '\0';
      }
      else {
        if (iVar2 <= piVar4[iVar9]) break;
        iVar3 = piVar7[iVar9];
        lVar8 = (long)iVar3;
        if (lVar8 != -1) {
          if (piVar4[lVar8] < iVar2) {
            piVar7[iVar9] = piVar11[lVar8];
            piVar11[lVar8] = iVar9;
            bVar15 = piVar7[lVar8] == -1;
            iVar9 = iVar3;
            if (bVar15) {
LAB_002a5972:
              cVar14 = bVar15 * '\x03';
              goto LAB_002a597c;
            }
          }
          *piVar13 = iVar9;
          piVar13 = piVar7 + iVar9;
          iVar9 = *piVar13;
          goto LAB_002a5929;
        }
LAB_002a596a:
        cVar14 = '\x03';
      }
LAB_002a597c:
    } while (cVar14 == '\0');
    piVar11 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    *piVar13 = piVar11[iVar9];
    piVar7 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar12 = piVar7[iVar9];
    piVar11[iVar9] = local_38;
    piVar7[iVar9] = local_34;
    piVar6[iVar1] = iVar9;
    if (piVar4[iVar10] < piVar4[iVar9]) {
      piVar11[iVar10] = piVar11[iVar9];
      piVar7[iVar10] = piVar6[iVar1];
      piVar11 = piVar11 + piVar6[iVar1];
    }
    else {
      piVar7[iVar10] = piVar7[iVar9];
      piVar11[iVar10] = piVar6[iVar1];
      piVar11 = piVar7 + piVar6[iVar1];
    }
  }
  *piVar11 = -1;
  piVar6[iVar1] = iVar10;
  iVar10 = piVar5[iVar10];
  piVar13 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + iVar10;
  *piVar13 = *piVar13 + 1;
  return iVar10;
}

Assistant:

void HighsGFkSolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);
  ++rowsize[Arow[pos]];
}